

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_Stream.cc
# Opt level: O0

JSON __thiscall
QPDFObjectHandle::getStreamJSON
          (QPDFObjectHandle *this,int json_version,qpdf_json_stream_data_e json_data,
          qpdf_stream_decode_level_e decode_level,Pipeline *p,string *data_filename)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  undefined4 in_register_00000034;
  JSON JVar1;
  QPDFObjectHandle local_40;
  string *local_30;
  Pipeline *p_local;
  qpdf_stream_decode_level_e local_20;
  qpdf_stream_decode_level_e decode_level_local;
  qpdf_json_stream_data_e json_data_local;
  int json_version_local;
  QPDFObjectHandle *this_local;
  
  _json_data_local = CONCAT44(in_register_00000034,json_version);
  p_local._4_4_ = (uint)p;
  local_30 = data_filename;
  local_20 = decode_level;
  decode_level_local = json_data;
  this_local = this;
  as_stream(&local_40,(typed)json_version);
  ::qpdf::Stream::getStreamJSON
            ((Stream *)this,(int)&local_40,decode_level_local,local_20,
             (Pipeline *)(ulong)p_local._4_4_,local_30);
  ::qpdf::Stream::~Stream((Stream *)&local_40);
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar1.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFObjectHandle::getStreamJSON(
    int json_version,
    qpdf_json_stream_data_e json_data,
    qpdf_stream_decode_level_e decode_level,
    Pipeline* p,
    std::string const& data_filename)
{
    return as_stream(error).getStreamJSON(json_version, json_data, decode_level, p, data_filename);
}